

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O0

pair<BigInt,_long_long> * __thiscall
BigInt::divModValue(pair<BigInt,_long_long> *__return_storage_ptr__,BigInt *this,longlong val)

{
  size_type sVar1;
  reference pvVar2;
  long lVar3;
  BigInt local_c8;
  undefined1 local_a5;
  int local_a4;
  long lStack_a0;
  int i;
  longlong temp;
  longlong remainder;
  BigInt result;
  BigInt local_60;
  undefined1 local_40 [8];
  string num;
  longlong val_local;
  BigInt *this_local;
  pair<BigInt,_long_long> *ret;
  
  BigInt(&local_60,this);
  to_string_abi_cxx11_((BigInt *)local_40);
  ~BigInt(&local_60);
  BigInt((BigInt *)&remainder,this);
  temp = 0;
  sVar1 = std::vector<long_long,_std::allocator<long_long>_>::size
                    ((vector<long_long,_std::allocator<long_long>_> *)&remainder);
  local_a4 = (int)sVar1;
  while (local_a4 = local_a4 + -1, -1 < local_a4) {
    pvVar2 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                       ((vector<long_long,_std::allocator<long_long>_> *)&remainder,(long)local_a4);
    lStack_a0 = *pvVar2 + temp * base;
    temp = lStack_a0 % val;
    lVar3 = lStack_a0 / val;
    pvVar2 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                       ((vector<long_long,_std::allocator<long_long>_> *)&remainder,(long)local_a4);
    *pvVar2 = lVar3;
  }
  local_a5 = 0;
  trim(&local_c8,(BigInt *)&remainder);
  std::pair<BigInt,_long_long>::pair<BigInt,_long_long_&,_true>
            (__return_storage_ptr__,&local_c8,&temp);
  ~BigInt(&local_c8);
  local_a5 = 1;
  ~BigInt((BigInt *)&remainder);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

pair<BigInt, long long> divModValue(long long val) const { //! divide by val
        auto num = BigInt(*this).to_string();

        BigInt result((*this));
        long long remainder = 0;
        long long temp;
        for (auto i = static_cast<int>(result.vector_value.size() - 1); i >= 0; i--) {
            temp = (result.vector_value[i] + remainder * base);
            remainder = temp % val;
            result.vector_value[i] = temp / val;
        }
        pair<BigInt, long long> ret (result.trim(), remainder);
        return ret;
    }